

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

double __thiscall VCCluster::energyWithItem(VCCluster *this,VCFace *f)

{
  double dVar1;
  double dVar2;
  ResScalar RVar3;
  ResScalar RVar4;
  Vector3d zi;
  Vector3d ws;
  Vector3d *local_50;
  Vector3d *local_48;
  double local_40;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_30 [24];
  
  local_50 = &this->weightedSum;
  local_48 = &f->center;
  local_40 = f->area;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_30,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)&local_50);
  dVar1 = this->area;
  dVar2 = f->area;
  (*this->_vptr_VCCluster[7])((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_50,this);
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_50,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_50);
  RVar4 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_50,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  return RVar3 * (dVar1 + dVar2) - (RVar4 + RVar4);
}

Assistant:

double VCCluster::energyWithItem(VCFace* f) {
	Vector3d ws = weightedSum + f->center * f->area;
	double a = area + f->area;
	Vector3d zi = center();
	return a * zi.dot(zi) - 2 * zi.dot(ws);
}